

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_array_sort(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  JSValue *pval;
  ulong *puVar4;
  JSValueUnion *pJVar5;
  ulong uVar6;
  long idx;
  ulong nmemb;
  JSValue v;
  JSValue v_00;
  JSValue JVar7;
  void *local_80;
  JSValueUnion local_78;
  long local_68;
  int64_t len;
  size_t slack;
  array_sort_context asc;
  
  asc.exception = 0;
  asc.has_method = 0;
  asc.method.u = argv->u;
  asc.method.tag = argv->tag;
  asc.ctx = ctx;
  if ((int)asc.method.tag == 3) {
LAB_0015501d:
    JVar7 = JS_ToObject(ctx,this_val);
    iVar1 = js_get_length64(ctx,&len,JVar7);
    uVar6 = 0;
    if (iVar1 == 0) {
      uVar6 = 0;
      local_68 = 0;
      nmemb = 0;
      uVar3 = 0;
      local_80 = (void *)0x0;
      for (idx = 0; local_78 = JVar7.u, idx < len; idx = idx + 1) {
        if (uVar3 <= nmemb) {
          uVar3 = (uVar3 >> 1) + uVar3 + 0x1f & 0xfffffffffffffff0;
          pvVar2 = js_realloc2(ctx,local_80,uVar3 << 5,&slack);
          if (pvVar2 == (void *)0x0) goto LAB_00155251;
          uVar3 = (slack >> 5) + uVar3;
          local_80 = pvVar2;
        }
        pval = (JSValue *)(nmemb * 0x20 + (long)local_80);
        iVar1 = JS_TryGetPropertyInt64(ctx,JVar7,idx,pval);
        if (iVar1 < 0) goto LAB_00155251;
        if (iVar1 != 0) {
          if ((int)pval->tag == 3) {
            local_68 = local_68 + 1;
          }
          else {
            pval[1].u.float64 = 0.0;
            pval[1].tag = idx;
            nmemb = nmemb + 1;
          }
        }
      }
      rqsort(local_80,nmemb,0x20,js_array_cmp_generic,&asc);
      if (asc.exception == 0) {
        puVar4 = (ulong *)((long)local_80 + 0x18);
        for (uVar6 = 0; nmemb != uVar6; uVar6 = uVar6 + 1) {
          if (((JSValueUnion *)(puVar4 + -1))->ptr != (void *)0x0) {
            v.tag = -7;
            v.u.ptr = ((JSValueUnion *)(puVar4 + -1))->ptr;
            JS_FreeValue(ctx,v);
          }
          if (uVar6 == *puVar4) {
            JS_FreeValue(ctx,*(JSValue *)(puVar4 + -3));
          }
          else {
            iVar1 = JS_SetPropertyInt64(ctx,JVar7,uVar6,*(JSValue *)(puVar4 + -3));
            if (iVar1 < 0) {
              uVar6 = uVar6 + 1;
              goto LAB_00155251;
            }
          }
          puVar4 = puVar4 + 4;
        }
        (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,local_80);
        for (; 0 < local_68; local_68 = local_68 + -1) {
          iVar1 = JS_SetPropertyInt64(ctx,JVar7,nmemb,(JSValue)(ZEXT816(3) << 0x40));
          if (iVar1 < 0) goto LAB_001552b2;
          nmemb = nmemb + 1;
        }
        do {
          if (len <= (long)nmemb) {
            return JVar7;
          }
          iVar1 = JS_DeletePropertyInt64(ctx,JVar7,nmemb,0x4000);
          nmemb = nmemb + 1;
        } while (-1 < iVar1);
        goto LAB_001552b2;
      }
      uVar6 = 0;
    }
    else {
      nmemb = 0;
      local_80 = (void *)0x0;
    }
  }
  else {
    iVar1 = check_function(ctx,*argv);
    if (iVar1 == 0) {
      asc.has_method = 1;
      goto LAB_0015501d;
    }
    uVar6 = 0;
    nmemb = 0;
    local_80 = (void *)0x0;
    JVar7 = (JSValue)(ZEXT816(3) << 0x40);
  }
LAB_00155251:
  pJVar5 = (JSValueUnion *)((long)local_80 + uVar6 * 0x20 + 0x10);
  for (; local_78 = JVar7.u, uVar6 < nmemb; uVar6 = uVar6 + 1) {
    JS_FreeValue(ctx,*(JSValue *)(pJVar5 + -2));
    if (pJVar5->ptr != (void *)0x0) {
      v_00.tag = -7;
      v_00.u.ptr = pJVar5->ptr;
      JS_FreeValue(ctx,v_00);
    }
    pJVar5 = pJVar5 + 4;
  }
  (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,local_80);
LAB_001552b2:
  JVar7.tag = JVar7.tag;
  JVar7.u.float64 = local_78.float64;
  JS_FreeValue(ctx,JVar7);
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_array_sort(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    struct array_sort_context asc = { ctx, 0, 0, argv[0] };
    JSValue obj = JS_UNDEFINED;
    ValueSlot *array = NULL;
    size_t array_size = 0, pos = 0, n = 0;
    int64_t i, len, undefined_count = 0;
    int present;

    if (!JS_IsUndefined(asc.method)) {
        if (check_function(ctx, asc.method))
            goto exception;
        asc.has_method = 1;
    }
    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    /* XXX: should special case fast arrays */
    for (i = 0; i < len; i++) {
        if (pos >= array_size) {
            size_t new_size, slack;
            ValueSlot *new_array;
            new_size = (array_size + (array_size >> 1) + 31) & ~15;
            new_array = js_realloc2(ctx, array, new_size * sizeof(*array), &slack);
            if (new_array == NULL)
                goto exception;
            new_size += slack / sizeof(*new_array);
            array = new_array;
            array_size = new_size;
        }
        present = JS_TryGetPropertyInt64(ctx, obj, i, &array[pos].val);
        if (present < 0)
            goto exception;
        if (present == 0)
            continue;
        if (JS_IsUndefined(array[pos].val)) {
            undefined_count++;
            continue;
        }
        array[pos].str = NULL;
        array[pos].pos = i;
        pos++;
    }
    rqsort(array, pos, sizeof(*array), js_array_cmp_generic, &asc);
    if (asc.exception)
        goto exception;

    /* XXX: should special case fast arrays */
    while (n < pos) {
        if (array[n].str)
            JS_FreeValue(ctx, JS_MKPTR(JS_TAG_STRING, array[n].str));
        if (array[n].pos == n) {
            JS_FreeValue(ctx, array[n].val);
        } else {
            if (JS_SetPropertyInt64(ctx, obj, n, array[n].val) < 0) {
                n++;
                goto exception;
            }
        }
        n++;
    }
    js_free(ctx, array);
    for (i = n; undefined_count-- > 0; i++) {
        if (JS_SetPropertyInt64(ctx, obj, i, JS_UNDEFINED) < 0)
            goto fail;
    }
    for (; i < len; i++) {
        if (JS_DeletePropertyInt64(ctx, obj, i, JS_PROP_THROW) < 0)
            goto fail;
    }
    return obj;

exception:
    for (; n < pos; n++) {
        JS_FreeValue(ctx, array[n].val);
        if (array[n].str)
            JS_FreeValue(ctx, JS_MKPTR(JS_TAG_STRING, array[n].str));
    }
    js_free(ctx, array);
fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}